

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int Gia_ManHashAnd(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Lit;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  Gia_Obj_t *pGVar14;
  
  if (iLit0 < 2) {
    if (iLit0 == 0) {
      iLit1 = 0;
    }
    return iLit1;
  }
  if (iLit1 < 2) {
    if (iLit1 != 0) {
      return iLit0;
    }
    return 0;
  }
  if (iLit0 == iLit1) {
    return iLit0;
  }
  iVar2 = Abc_LitNot(iLit1);
  if (iVar2 == iLit0) {
    return 0;
  }
  if (p->fGiaSimple != 0) {
    if ((p->vHTable).nSize == 0) {
      iVar2 = Gia_ManAppendAnd(p,iLit0,iLit1);
      return iVar2;
    }
    __assert_fail("Vec_IntSize(&p->vHTable) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0x24c,"int Gia_ManHashAnd(Gia_Man_t *, int, int)");
  }
  if (((char)p->nObjs == '\0') &&
     (iVar2 = (p->vHTable).nSize, iVar3 = Gia_ManAndNum(p), iVar2 * 2 < iVar3)) {
    Gia_ManHashResize(p);
  }
  if (p->fAddStrash == 0) goto LAB_001ef36e;
  pGVar4 = Gia_ObjFromLit(p,iLit0);
  pGVar5 = Gia_ObjFromLit(p,iLit1);
  if (p->fAddStrash == 0) {
    __assert_fail("p->fAddStrash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0x159,"Gia_Obj_t *Gia_ManAddStrash(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pGVar10 = (Gia_Obj_t *)((ulong)pGVar4 & 0xfffffffffffffffe);
  pGVar14 = (Gia_Obj_t *)((ulong)pGVar5 & 0xfffffffffffffffe);
  uVar12 = *(ulong *)pGVar10;
  if ((int)uVar12 < 0 || (uVar12 & 0x1fffffff) == 0x1fffffff) {
    uVar12 = *(ulong *)pGVar14;
    uVar9 = uVar12 & 0x1fffffff;
    if (uVar9 == 0x1fffffff || (int)uVar12 < 0) goto LAB_001ef36e;
    pGVar11 = (Gia_Obj_t *)0x0;
    pGVar10 = (Gia_Obj_t *)0x0;
  }
  else {
    pGVar11 = (Gia_Obj_t *)
              ((ulong)((uint)(uVar12 >> 0x1d) & 1) | (ulong)(pGVar10 + -(uVar12 & 0x1fffffff)));
    pGVar10 = Gia_ObjChild1(pGVar10);
    uVar12 = *(ulong *)pGVar14;
    uVar9 = (ulong)((uint)uVar12 & 0x1fffffff);
  }
  if ((int)uVar9 == 0x1fffffff || (int)uVar12 < 0) {
    pGVar13 = (Gia_Obj_t *)0x0;
    pGVar14 = (Gia_Obj_t *)0x0;
  }
  else {
    pGVar13 = (Gia_Obj_t *)((ulong)((uint)(uVar12 >> 0x1d) & 1) | (ulong)(pGVar14 + -uVar9));
    pGVar14 = Gia_ObjChild1(pGVar14);
  }
  pGVar8 = (Gia_Obj_t *)((ulong)pGVar5 ^ 1);
  pGVar6 = pGVar4;
  if (((ulong)pGVar4 & 1) == 0) {
    if (pGVar10 != pGVar8 && pGVar11 != pGVar8) {
      if ((pGVar11 != pGVar5) && (pGVar10 != pGVar5)) {
LAB_001ef13a:
        pGVar8 = (Gia_Obj_t *)((ulong)pGVar4 ^ 1);
        if (((ulong)pGVar5 & 1) == 0) {
          if (pGVar14 == pGVar8 || pGVar13 == pGVar8) goto LAB_001ef0f7;
          pGVar6 = pGVar5;
          if ((pGVar13 != pGVar4) && (pGVar14 != pGVar4)) {
            pGVar8 = (Gia_Obj_t *)((ulong)pGVar13 ^ 1);
            if (((ulong)pGVar4 & 1) == 0) {
              if ((((pGVar11 == pGVar8) || (pGVar11 == (Gia_Obj_t *)((ulong)pGVar14 ^ 1))) ||
                  (pGVar10 == pGVar8)) || (pGVar10 == (Gia_Obj_t *)((ulong)pGVar14 ^ 1)))
              goto LAB_001ef0f7;
              pGVar6 = pGVar14;
              pGVar8 = pGVar4;
              if (((pGVar11 != pGVar13) && (pGVar10 != pGVar13)) &&
                 ((pGVar6 = pGVar5, pGVar8 = pGVar11, pGVar10 != pGVar14 &&
                  (pGVar6 = pGVar13, pGVar8 = pGVar4, pGVar11 != pGVar14)))) goto LAB_001ef36e;
            }
            else {
              if (((pGVar11 == pGVar8) || (pGVar11 == (Gia_Obj_t *)((ulong)pGVar14 ^ 1))) ||
                 ((pGVar10 == pGVar8 || (pGVar10 == (Gia_Obj_t *)((ulong)pGVar14 ^ 1)))))
              goto LAB_001ef1fa;
              if ((pGVar10 == pGVar13) || (pGVar10 == pGVar14)) {
                pGVar8 = (Gia_Obj_t *)((ulong)pGVar11 ^ 1);
              }
              else {
                if ((pGVar11 != pGVar13) && (pGVar11 != pGVar14)) goto LAB_001ef36e;
                pGVar8 = (Gia_Obj_t *)((ulong)pGVar10 ^ 1);
              }
            }
LAB_001ef1f2:
            pGVar6 = Gia_ManHashAndP(p,pGVar8,pGVar6);
          }
        }
        else {
          pGVar6 = pGVar4;
          if (pGVar14 != pGVar8 && pGVar13 != pGVar8) {
            if (pGVar14 == pGVar4) {
              pGVar6 = pGVar14;
              pGVar8 = (Gia_Obj_t *)((ulong)pGVar13 ^ 1);
            }
            else if (pGVar13 == pGVar4) {
              pGVar6 = pGVar13;
              pGVar8 = (Gia_Obj_t *)((ulong)pGVar14 ^ 1);
            }
            else {
              if (((ulong)pGVar4 & 1) != 0) {
                if ((pGVar11 == pGVar14) && (pGVar10 == (Gia_Obj_t *)((ulong)pGVar13 ^ 1))) {
LAB_001ef31f:
                  pGVar6 = (Gia_Obj_t *)((ulong)pGVar11 ^ 1);
                }
                else {
                  if ((pGVar10 != pGVar13) || (pGVar11 != (Gia_Obj_t *)((ulong)pGVar14 ^ 1))) {
                    if ((pGVar11 == pGVar13) && (pGVar10 == (Gia_Obj_t *)((ulong)pGVar14 ^ 1)))
                    goto LAB_001ef31f;
                    if ((pGVar10 != pGVar14) || (pGVar11 != (Gia_Obj_t *)((ulong)pGVar13 ^ 1)))
                    goto LAB_001ef36e;
                  }
                  pGVar6 = (Gia_Obj_t *)((ulong)pGVar10 ^ 1);
                }
                goto LAB_001ef1fa;
              }
              if ((((pGVar13 == (Gia_Obj_t *)((ulong)pGVar11 ^ 1)) ||
                   (pGVar13 == (Gia_Obj_t *)((ulong)pGVar10 ^ 1))) ||
                  (pGVar14 == (Gia_Obj_t *)((ulong)pGVar11 ^ 1))) ||
                 (pGVar14 == (Gia_Obj_t *)((ulong)pGVar10 ^ 1))) goto LAB_001ef1fa;
              pGVar5 = pGVar13;
              if (((pGVar14 != pGVar11) && (pGVar14 != pGVar10)) &&
                 ((pGVar5 = pGVar14, pGVar13 != pGVar11 && (pGVar13 != pGVar10))))
              goto LAB_001ef36e;
              pGVar8 = (Gia_Obj_t *)((ulong)pGVar5 ^ 1);
            }
            goto LAB_001ef1f2;
          }
        }
      }
    }
    else {
LAB_001ef0f7:
      pGVar6 = p->pObjs;
    }
  }
  else {
    pGVar6 = pGVar5;
    if (pGVar10 != pGVar8 && pGVar11 != pGVar8) {
      if (pGVar10 == pGVar5) {
        pGVar6 = pGVar10;
        pGVar8 = (Gia_Obj_t *)((ulong)pGVar11 ^ 1);
      }
      else {
        if (pGVar11 != pGVar5) goto LAB_001ef13a;
        pGVar6 = pGVar11;
        pGVar8 = (Gia_Obj_t *)((ulong)pGVar10 ^ 1);
      }
      goto LAB_001ef1f2;
    }
  }
LAB_001ef1fa:
  if (pGVar6 != (Gia_Obj_t *)0x0) {
    iVar2 = Gia_ObjToLit(p,pGVar6);
    return iVar2;
  }
LAB_001ef36e:
  iVar2 = iLit1;
  if ((uint)iLit0 >= (uint)iLit1 && iLit0 != iLit1) {
    iVar2 = iLit0;
  }
  if ((uint)iLit0 < (uint)iLit1) {
    iLit1 = iLit0;
  }
  piVar7 = Gia_ManHashFind(p,iLit1,iVar2,-1);
  iVar3 = *piVar7;
  if (iVar3 == 0) {
    p->nHashMiss = p->nHashMiss + 1;
    iVar3 = (p->vHash).nSize;
    iVar1 = (p->vHash).nCap;
    Lit = Gia_ManAppendAnd(p,iLit1,iVar2);
    if ((iVar1 <= iVar3) && (piVar7 = Gia_ManHashFind(p,iLit1,iVar2,-1), *piVar7 != 0)) {
      __assert_fail("*pPlace == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                    ,0x267,"int Gia_ManHashAnd(Gia_Man_t *, int, int)");
    }
    iVar3 = Abc_Lit2Var(Lit);
    *piVar7 = iVar3;
  }
  else {
    p->nHashHit = p->nHashHit + 1;
  }
  iVar2 = Abc_Var2Lit(iVar3,0);
  return iVar2;
}

Assistant:

int Gia_ManHashAnd( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( iLit0 < 2 )
        return iLit0 ? iLit1 : 0;
    if ( iLit1 < 2 )
        return iLit1 ? iLit0 : 0;
    if ( iLit0 == iLit1 )
        return iLit1;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 0;
    if ( p->fGiaSimple )
    {
        assert( Vec_IntSize(&p->vHTable) == 0 );
        return Gia_ManAppendAnd( p, iLit0, iLit1 );
    }
    if ( (p->nObjs & 0xFF) == 0 && 2 * Vec_IntSize(&p->vHTable) < Gia_ManAndNum(p) )
        Gia_ManHashResize( p );
    if ( p->fAddStrash )
    {
        Gia_Obj_t * pObj = Gia_ManAddStrash( p, Gia_ObjFromLit(p, iLit0), Gia_ObjFromLit(p, iLit1) );
        if ( pObj != NULL )
            return Gia_ObjToLit( p, pObj );
    }
    if ( iLit0 > iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    {
        int * pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_Var2Lit( *pPlace, 0 );
        }
        p->nHashMiss++;
        if ( Vec_IntSize(&p->vHash) < Vec_IntCap(&p->vHash) )
            *pPlace = Abc_Lit2Var( Gia_ManAppendAnd( p, iLit0, iLit1 ) );
        else
        {
            int iNode = Gia_ManAppendAnd( p, iLit0, iLit1 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
            assert( *pPlace == 0 );
            *pPlace = Abc_Lit2Var( iNode );
        }
        return Abc_Var2Lit( *pPlace, 0 );
    }
}